

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::Rule>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,pointer pos,Rule *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pRVar4;
  long lVar5;
  pointer pRVar6;
  iterator __result;
  void *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Rule *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *)0x4914eb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pRVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pRVar4;
  pRVar6 = (pointer)operator_new(0x49154d);
  memcpy(pRVar6 + lVar5 / 0x48,in_RDX,0x48);
  pRVar4 = end(in_RDI);
  if (in_RSI == pRVar4) {
    __result = begin(in_RDI);
    pRVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::RandSeqProductionSymbol::Rule*,slang::ast::RandSeqProductionSymbol::Rule*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::RandSeqProductionSymbol::Rule*,slang::ast::RandSeqProductionSymbol::Rule*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pRVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::RandSeqProductionSymbol::Rule*,slang::ast::RandSeqProductionSymbol::Rule*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pRVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pRVar6;
  return pRVar6 + lVar5 / 0x48;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}